

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

uint nsvg__parseColor(char *str)

{
  size_t sVar1;
  size_t len;
  char *str_local;
  
  for (len = (size_t)str; *(char *)len == ' '; len = len + 1) {
  }
  sVar1 = strlen((char *)len);
  if ((sVar1 == 0) || (*(char *)len != '#')) {
    if (((sVar1 < 4) ||
        (((*(char *)len != 'r' || (*(char *)(len + 1) != 'g')) || (*(char *)(len + 2) != 'b')))) ||
       (*(char *)(len + 3) != '(')) {
      str_local._4_4_ = nsvg__parseColorName((char *)len);
    }
    else {
      str_local._4_4_ = nsvg__parseColorRGB((char *)len);
    }
  }
  else {
    str_local._4_4_ = nsvg__parseColorHex((char *)len);
  }
  return str_local._4_4_;
}

Assistant:

static unsigned int nsvg__parseColor(const char* str)
{
	size_t len = 0;
	while(*str == ' ') ++str;
	len = strlen(str);
	if (len >= 1 && *str == '#')
		return nsvg__parseColorHex(str);
	else if (len >= 4 && str[0] == 'r' && str[1] == 'g' && str[2] == 'b' && str[3] == '(')
		return nsvg__parseColorRGB(str);
	return nsvg__parseColorName(str);
}